

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_CreateStringArray(char **strings,int count)

{
  cJSON *item;
  cJSON *pcVar1;
  ulong uVar2;
  cJSON *pcVar3;
  bool bVar4;
  
  if (strings == (char **)0x0 || count < 0) {
LAB_001046bb:
    item = (cJSON *)0x0;
  }
  else {
    item = (cJSON *)(*global_hooks.allocate)(0x40);
    if (item != (cJSON *)0x0) {
      item->child = (cJSON *)0x0;
      *(undefined8 *)&item->type = 0;
      item->valuedouble = 0.0;
      item->string = (char *)0x0;
      item->valuestring = (char *)0x0;
      *(undefined8 *)&item->valueint = 0;
      item->next = (cJSON *)0x0;
      item->prev = (cJSON *)0x0;
      item->type = 0x20;
    }
    if (count == 0 || item == (cJSON *)0x0) {
      pcVar1 = (cJSON *)0x0;
    }
    else {
      uVar2 = 1;
      pcVar3 = (cJSON *)0x0;
      do {
        pcVar1 = cJSON_CreateString(strings[uVar2 - 1]);
        if (pcVar1 == (cJSON *)0x0) {
          cJSON_Delete(item);
          goto LAB_001046bb;
        }
        if (uVar2 == 1) {
          item->child = pcVar1;
        }
        else {
          pcVar3->next = pcVar1;
          pcVar1->prev = pcVar3;
        }
      } while ((item != (cJSON *)0x0) &&
              (bVar4 = uVar2 < (uint)count, uVar2 = uVar2 + 1, pcVar3 = pcVar1, bVar4));
    }
    if ((item != (cJSON *)0x0) && (item->child != (cJSON *)0x0)) {
      item->child->prev = pcVar1;
    }
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateStringArray(const char *const *strings, int count)
{
    size_t i = 0;
    cJSON *n = NULL;
    cJSON *p = NULL;
    cJSON *a = NULL;

    if ((count < 0) || (strings == NULL))
    {
        return NULL;
    }

    a = cJSON_CreateArray();

    for (i = 0; a && (i < (size_t)count); i++)
    {
        n = cJSON_CreateString(strings[i]);
        if(!n)
        {
            cJSON_Delete(a);
            return NULL;
        }
        if(!i)
        {
            a->child = n;
        }
        else
        {
            suffix_object(p,n);
        }
        p = n;
    }

    if (a && a->child) {
        a->child->prev = n;
    }

    return a;
}